

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCreateCharEncodingHandler
              (char *name,int output,xmlCharEncConvImpl impl,void *implCtxt,
              xmlCharEncodingHandler **out)

{
  xmlCharEncoding xVar1;
  char *pcVar2;
  xmlCharEncodingInputFunc local_60;
  xmlCharEncoding enc;
  char *nalias;
  char *norig;
  xmlCharEncodingHandler *handler;
  xmlCharEncodingHandler **out_local;
  void *implCtxt_local;
  xmlCharEncConvImpl impl_local;
  char *pcStack_18;
  int output_local;
  char *name_local;
  
  if (out == (xmlCharEncodingHandler **)0x0) {
    name_local._4_4_ = 0x73;
  }
  else {
    *out = (xmlCharEncodingHandler *)0x0;
    if (name == (char *)0x0) {
      name_local._4_4_ = 0x73;
    }
    else {
      pcVar2 = xmlGetEncodingAlias(name);
      pcStack_18 = name;
      if (pcVar2 != (char *)0x0) {
        pcStack_18 = pcVar2;
      }
      xVar1 = xmlParseCharEncodingInternal(pcStack_18);
      if (xVar1 == XML_CHAR_ENCODING_UTF8) {
        name_local._4_4_ = 0;
      }
      else {
        if ((XML_CHAR_ENCODING_NONE < xVar1) && ((uint)xVar1 < 0x1f)) {
          if (output == 0) {
            local_60 = defaultHandlers[xVar1].input;
          }
          else {
            local_60 = defaultHandlers[xVar1].output;
          }
          if (local_60 != (xmlCharEncodingInputFunc)0x0) {
            *out = defaultHandlers + xVar1;
            return 0;
          }
        }
        name_local._4_4_ = xmlFindExtraHandler(name,pcStack_18,output,impl,implCtxt,out);
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

int
xmlCreateCharEncodingHandler(const char *name, int output,
                             xmlCharEncConvImpl impl, void *implCtxt,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;
    const char *norig, *nalias;
    xmlCharEncoding enc;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if (name == NULL)
        return(XML_ERR_ARGUMENT);

    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    enc = xmlParseCharEncodingInternal(name);

    /* Return NULL handler for UTF-8 */
    if (enc == XML_CHAR_ENCODING_UTF8)
        return(XML_ERR_OK);

    if ((enc > 0) && ((size_t) enc < NUM_DEFAULT_HANDLERS)) {
        handler = &defaultHandlers[enc];
        if ((output ? handler->output : handler->input) != NULL) {
            *out = (xmlCharEncodingHandler *) handler;
            return(XML_ERR_OK);
        }
    }

    return(xmlFindExtraHandler(norig, name, output, impl, implCtxt, out));
}